

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O0

void __thiscall gui::TextBoxStyle::TextBoxStyle(TextBoxStyle *this,Gui *gui)

{
  Gui *in_RSI;
  RectangleShape *in_RDI;
  Vector2f *in_stack_ffffffffffffffb8;
  Vector2f *size;
  Text *in_stack_ffffffffffffffd0;
  Vector2<float> local_18 [3];
  
  Style::Style((Style *)in_RDI,in_RSI);
  (in_RDI->super_Shape).super_Drawable._vptr_Drawable = (_func_int **)&PTR__TextBoxStyle_0047fae8;
  sf::Vector2<float>::Vector2(local_18,0.0,0.0);
  sf::RectangleShape::RectangleShape(in_RDI,in_stack_ffffffffffffffb8);
  size = &in_RDI[1].super_Shape.super_Transformable.m_origin;
  sf::Vector2<float>::Vector2((Vector2<float> *)&stack0xffffffffffffffd4,0.0,0.0);
  sf::RectangleShape::RectangleShape(in_RDI,size);
  sf::Text::Text(in_stack_ffffffffffffffd0);
  sf::Color::Color((Color *)&in_RDI[3].super_Shape.super_Transformable.m_scale.y);
  sf::Color::Color((Color *)&in_RDI[3].super_Shape.super_Transformable.m_transform);
  sf::Color::Color((Color *)(in_RDI[3].super_Shape.super_Transformable.m_transform.m_matrix + 1));
  sf::Color::Color((Color *)(in_RDI[3].super_Shape.super_Transformable.m_transform.m_matrix + 2));
  sf::Vector3<float>::Vector3
            ((Vector3<float> *)(in_RDI[3].super_Shape.super_Transformable.m_transform.m_matrix + 3))
  ;
  return;
}

Assistant:

TextBoxStyle::TextBoxStyle(const Gui& gui) :
    Style(gui) {
}